

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlindex.cpp
# Opt level: O2

void __thiscall QSqlIndex::QSqlIndex(QSqlIndex *this,QSqlIndex *other)

{
  QSqlRecord::QSqlRecord(&this->super_QSqlRecord,&other->super_QSqlRecord);
  QArrayDataPointer<char16_t>::QArrayDataPointer(&(this->cursor).d,&(other->cursor).d);
  QArrayDataPointer<char16_t>::QArrayDataPointer(&(this->nm).d,&(other->nm).d);
  QArrayDataPointer<bool>::QArrayDataPointer(&(this->sorts).d,&(other->sorts).d);
  return;
}

Assistant:

QSqlIndex::QSqlIndex(const QSqlIndex& other)
    : QSqlRecord(other), cursor(other.cursor), nm(other.nm), sorts(other.sorts)
{
}